

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

_Bool Curl_conn_cf_is_ssl(Curl_cfilter *cf)

{
  uint uVar1;
  
  while( true ) {
    if (cf == (Curl_cfilter *)0x0) {
      return false;
    }
    uVar1 = cf->cft->flags;
    if ((uVar1 & 2) != 0) break;
    if ((uVar1 & 1) != 0) {
      return false;
    }
    cf = cf->next;
  }
  return true;
}

Assistant:

bool Curl_conn_cf_is_ssl(struct Curl_cfilter *cf)
{
  for(; cf; cf = cf->next) {
    if(cf->cft->flags & CF_TYPE_SSL)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
  }
  return FALSE;
}